

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

Result wabt::ApplyNames(Module *module)

{
  Func *func;
  pointer pTVar1;
  pointer pTVar2;
  Export *pEVar3;
  ElemSegment *pEVar4;
  pointer piVar5;
  DataSegment *pDVar6;
  Result RVar7;
  Index IVar8;
  pointer ppFVar9;
  pointer ppGVar10;
  pointer ppTVar11;
  pointer ppEVar12;
  pointer ppEVar13;
  pointer ppDVar14;
  pointer ppVVar15;
  pointer ppTVar16;
  Enum EVar17;
  ulong uVar18;
  pointer piVar19;
  NameApplier applier;
  Delegate local_e0;
  Module *local_d8;
  Func *pFStack_d0;
  ExprVisitor local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  
  local_e0._vptr_Delegate = (_func_int **)&PTR__NameApplier_001782a0;
  local_d8 = (Module *)0x0;
  pFStack_d0 = (Func *)0x0;
  ExprVisitor::ExprVisitor(&local_c8,&local_e0);
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar9 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_d8 = module;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar9) {
    uVar18 = 0;
    do {
      func = ppFVar9[uVar18];
      pFStack_d0 = func;
      if (((func->decl).has_func_type == true) &&
         (RVar7 = anon_unknown_13::NameApplier::UseNameForFuncTypeVar
                            ((NameApplier *)local_d8,&(func->decl).type_var), RVar7.enum_ == Error))
      {
LAB_001150b2:
        EVar17 = Error;
        goto LAB_001150c5;
      }
      pTVar1 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar2 = (func->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      IVar8 = LocalTypes::size(&func->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)((int)((ulong)((long)pTVar1 - (long)pTVar2) >> 3) + IVar8),&func->bindings,
                 &local_60);
      RVar7 = ExprVisitor::VisitFunc(&local_c8,func);
      if (RVar7.enum_ == Error) goto LAB_001150b2;
      pFStack_d0 = (Func *)0x0;
      uVar18 = uVar18 + 1;
      ppFVar9 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(module->funcs).
                                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar9 >> 3))
    ;
  }
  ppGVar10 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar10) {
    uVar18 = 0;
    do {
      RVar7 = ExprVisitor::VisitExprList(&local_c8,&ppGVar10[uVar18]->init_expr);
      if (RVar7.enum_ == Error) goto LAB_001150b9;
      uVar18 = uVar18 + 1;
      ppGVar10 = (module->globals).
                 super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar10 >> 3
                             ));
  }
  ppTVar11 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar16 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppTVar16 != ppTVar11) {
    uVar18 = 0;
    do {
      if ((ppTVar11[uVar18]->decl).has_func_type == true) {
        RVar7 = anon_unknown_13::NameApplier::UseNameForFuncTypeVar
                          ((NameApplier *)local_d8,&(ppTVar11[uVar18]->decl).type_var);
        if (RVar7.enum_ == Error) goto LAB_001150b9;
        ppTVar11 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar16 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)((long)ppTVar16 - (long)ppTVar11 >> 3));
  }
  ppEVar12 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar12) {
    uVar18 = 0;
    do {
      pEVar3 = ppEVar12[uVar18];
      switch(pEVar3->kind) {
      case First:
        anon_unknown_13::NameApplier::UseNameForFuncVar((NameApplier *)local_d8,&pEVar3->var);
        break;
      case Table:
        anon_unknown_13::NameApplier::UseNameForTableVar((NameApplier *)local_d8,&pEVar3->var);
        break;
      case Memory:
        anon_unknown_13::NameApplier::UseNameForMemoryVar((NameApplier *)local_d8,&pEVar3->var);
        break;
      case Global:
        anon_unknown_13::NameApplier::UseNameForGlobalVar((NameApplier *)local_d8,&pEVar3->var);
        break;
      case Last:
        anon_unknown_13::NameApplier::UseNameForTagVar((NameApplier *)local_d8,&pEVar3->var);
      }
      uVar18 = uVar18 + 1;
      ppEVar12 = (module->exports).
                 super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(module->exports).
                                    super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar12 >> 3
                             ));
  }
  ppEVar13 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar13) {
    uVar18 = 0;
    EVar17 = Error;
    do {
      pEVar4 = ppEVar13[uVar18];
      RVar7 = anon_unknown_13::NameApplier::UseNameForTableVar
                        ((NameApplier *)local_d8,&pEVar4->table_var);
      if ((RVar7.enum_ == Error) ||
         (RVar7 = ExprVisitor::VisitExprList(&local_c8,&pEVar4->offset), RVar7.enum_ == Error))
      goto LAB_001150c5;
      piVar5 = (pEVar4->elem_exprs).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (piVar19 = (pEVar4->elem_exprs).
                     super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; piVar19 != piVar5;
          piVar19 = piVar19 + 1) {
        if (piVar19->size_ == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                        ,0x183,
                        "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::front() [T = wabt::Expr]"
                       );
        }
        if ((piVar19->first_->type_ == RefFunc) &&
           (RVar7 = anon_unknown_13::NameApplier::UseNameForFuncVar
                              ((NameApplier *)local_d8,(Var *)(piVar19->first_ + 1)),
           RVar7.enum_ == Error)) goto LAB_001150c5;
      }
      uVar18 = uVar18 + 1;
      ppEVar13 = (module->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(module->elem_segments).
                                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar13 >> 3
                             ));
  }
  ppDVar14 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar14) {
    uVar18 = 0;
    EVar17 = Error;
    do {
      pDVar6 = ppDVar14[uVar18];
      RVar7 = anon_unknown_13::NameApplier::UseNameForMemoryVar
                        ((NameApplier *)local_d8,&pDVar6->memory_var);
      if ((RVar7.enum_ == Error) ||
         (RVar7 = ExprVisitor::VisitExprList(&local_c8,&pDVar6->offset), RVar7.enum_ == Error))
      goto LAB_001150c5;
      uVar18 = uVar18 + 1;
      ppDVar14 = (module->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(module->data_segments).
                                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar14 >> 3
                             ));
  }
  ppVVar15 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar15) {
    uVar18 = 0;
    do {
      RVar7 = anon_unknown_13::NameApplier::UseNameForFuncVar
                        ((NameApplier *)local_d8,ppVVar15[uVar18]);
      if (RVar7.enum_ == Error) goto LAB_001150b9;
      uVar18 = uVar18 + 1;
      ppVVar15 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(module->starts).
                                    super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar15 >> 3)
            );
  }
  local_d8 = (Module *)0x0;
  EVar17 = Ok;
LAB_001150c5:
  local_e0._vptr_Delegate = (_func_int **)&PTR__NameApplier_001782a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if (local_c8.catch_index_stack_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.catch_index_stack_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar17;
LAB_001150b9:
  EVar17 = Error;
  goto LAB_001150c5;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}